

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_internal.h
# Opt level: O2

bool __thiscall
bssl::InplaceVector<unsigned_char,_64UL>::TryResize
          (InplaceVector<unsigned_char,_64UL> *this,size_t new_size)

{
  size_t __len;
  ulong uVar1;
  
  uVar1 = (ulong)this->size_;
  if (uVar1 < new_size) {
    if (0x40 < new_size) {
      return false;
    }
    this->storage_[uVar1] = '\0';
    if (~uVar1 + new_size != 0) {
      memset(this->storage_ + uVar1 + 1,0,~uVar1 + new_size);
    }
    this->size_ = (PackedSize<64UL>)new_size;
  }
  else {
    Shrink(this,new_size);
  }
  return true;
}

Assistant:

[[nodiscard]] bool TryResize(size_t new_size) {
    if (new_size <= size_) {
      Shrink(new_size);
      return true;
    }
    if (new_size > capacity()) {
      return false;
    }
    std::uninitialized_value_construct_n(data() + size_, new_size - size_);
    size_ = static_cast<PackedSize<N>>(new_size);
    return true;
  }